

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmGlobalGenerator *gg_00;
  cmServerRequest *pcVar1;
  bool bVar2;
  int iVar3;
  cmFileMonitor *pcVar4;
  cmake *cm_00;
  ulong uVar5;
  Value *other;
  pointer pVVar6;
  char *pcVar7;
  cmState *pcVar8;
  const_iterator cVar9;
  bool local_671;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  Value local_4e8;
  anon_class_8_1_8991fb9c local_4c0;
  Callback local_4b8;
  string local_498;
  undefined1 local_478 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  string local_458;
  int local_438;
  allocator local_431;
  int ret;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  byte local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  allocator local_369;
  string local_368;
  char *local_348;
  char *cachedGenerator;
  string local_338 [39];
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  char *local_2c8;
  char *cachedSourceDir;
  string local_2b8;
  cmGlobalGenerator *local_298;
  cmGlobalGenerator *gg;
  undefined1 local_288 [8];
  string buildDir;
  undefined1 local_260 [8];
  string sourceDir;
  string local_238;
  cmServerResponse local_218;
  string local_188;
  _Base_ptr local_168;
  undefined1 local_160;
  SelfType local_158;
  _Base_ptr local_148;
  undefined1 local_140;
  undefined1 local_138 [8];
  const_iterator i;
  undefined1 local_108 [8];
  Value passedArgs;
  bool cacheArgumentsError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  cmake *cm;
  string errorMessage;
  allocator local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if (this->m_State == STATE_INACTIVE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"This instance is inactive.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return __return_storage_ptr__;
  }
  pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
  cmFileMonitor::StopMonitoring(pcVar4);
  std::__cxx11::string::string((string *)&cm);
  cm_00 = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm_00,(string *)&cm);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmServerRequest::ReportError(__return_storage_ptr__,local_20,(string *)&cm);
    cacheArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_0086f06d;
  }
  passedArgs.limit_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"unused",(allocator *)((long)&passedArgs.limit_ + 7));
  passedArgs.limit_._6_1_ = 0;
  local_b0 = &local_d0;
  local_a8 = 1;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&passedArgs.limit_ + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&passedArgs.limit_ + 5));
  local_538 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  do {
    local_538 = local_538 + -1;
    std::__cxx11::string::~string((string *)local_538);
  } while (local_538 != &local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&passedArgs.limit_ + 7));
  passedArgs.limit_._4_1_ = 0;
  other = Json::Value::operator[](&local_20->Data,&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
  Json::Value::Value((Value *)local_108,other);
  bVar2 = Json::Value::isNull((Value *)local_108);
  if (!bVar2) {
    bVar2 = Json::Value::isString((Value *)local_108);
    if (bVar2) {
      Json::Value::asString_abi_cxx11_
                ((string *)&i.super_ValueIteratorBase.isNull_,(Value *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0,(value_type *)&i.super_ValueIteratorBase.isNull_);
      std::__cxx11::string::~string((string *)&i.super_ValueIteratorBase.isNull_);
    }
    else {
      bVar2 = Json::Value::isArray((Value *)local_108);
      if (bVar2) {
        cVar9 = Json::Value::begin((Value *)local_108);
        local_148 = (_Base_ptr)cVar9.super_ValueIteratorBase.current_._M_node;
        local_140 = cVar9.super_ValueIteratorBase.isNull_;
        local_138 = (undefined1  [8])local_148;
        i.super_ValueIteratorBase.current_._M_node._0_1_ = local_140;
        while( true ) {
          cVar9 = Json::Value::end((Value *)local_108);
          local_168 = (_Base_ptr)cVar9.super_ValueIteratorBase.current_._M_node;
          local_160 = cVar9.super_ValueIteratorBase.isNull_;
          local_158.current_._M_node = local_168;
          local_158.isNull_ = (bool)local_160;
          bVar2 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_138,&local_158);
          if (!bVar2) break;
          pVVar6 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_138);
          bVar2 = Json::Value::isString(pVVar6);
          if (!bVar2) {
            passedArgs.limit_._4_1_ = 1;
            break;
          }
          pVVar6 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_138);
          Json::Value::asString_abi_cxx11_(&local_188,pVVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a0,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_138);
        }
      }
      else {
        passedArgs.limit_._4_1_ = 1;
      }
    }
  }
  pcVar1 = local_20;
  if ((passedArgs.limit_._4_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,"cacheArguments must be unset, a string or an array of strings."
               ,(allocator *)(sourceDir.field_2._M_local_buf + 0xf));
    cmServerRequest::ReportError(&local_218,pcVar1,&local_238);
    cmServerResponse::~cmServerResponse(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
  }
  pcVar7 = cmake::GetHomeDirectory(cm_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_260,pcVar7,(allocator *)(buildDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(buildDir.field_2._M_local_buf + 0xf));
  pcVar7 = cmake::GetHomeOutputDirectory(cm_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_288,pcVar7,(allocator *)((long)&gg + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gg + 7));
  local_298 = cmake::GetGlobalGenerator(cm_00);
  uVar5 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar5 & 1) == 0) {
    bVar2 = cmake::LoadCache(cm_00,(string *)local_288);
    if (bVar2) {
      pcVar8 = cmake::GetState(cm_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e8,"CMAKE_HOME_DIRECTORY",&local_2e9);
      pcVar7 = cmState::GetInitializedCacheValue(pcVar8,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      pcVar1 = local_20;
      local_2c8 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_310,"No CMAKE_HOME_DIRECTORY found in cache.",&local_311);
        cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        cacheArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      else {
        uVar5 = std::__cxx11::string::empty();
        pcVar7 = local_2c8;
        if ((uVar5 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_338,pcVar7,(allocator *)((long)&cachedGenerator + 7));
          std::__cxx11::string::operator=((string *)local_260,local_338);
          std::__cxx11::string::~string(local_338);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cachedGenerator + 7));
          cmake::SetHomeDirectory(cm_00,(string *)local_260);
        }
        pcVar8 = cmake::GetState(cm_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_368,"CMAKE_GENERATOR",&local_369);
        pcVar7 = cmState::GetInitializedCacheValue(pcVar8,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
        local_348 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          local_391 = 0;
          local_671 = false;
          if (local_298 != (cmGlobalGenerator *)0x0) {
            (*local_298->_vptr_cmGlobalGenerator[3])(&local_390);
            local_391 = 1;
            local_671 = std::operator!=(&local_390,local_348);
          }
          if ((local_391 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_390);
          }
          pcVar1 = local_20;
          if (local_671 != false) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_3b8,
                       "Configured generator does not match with CMAKE_GENERATOR found in cache.",
                       &local_3b9);
            cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_3b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
            cacheArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            goto LAB_0086f009;
          }
        }
LAB_0086ebdb:
        cmSystemTools::ResetErrorOccuredFlag();
        iVar3 = cmake::AddCMakePaths(cm_00);
        pcVar1 = local_20;
        if (iVar3 == 1) {
          bVar2 = cmake::SetCacheArgs(cm_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_a0);
          pcVar1 = local_20;
          if (bVar2) {
            local_438 = cmake::Configure(cm_00);
            pcVar1 = local_20;
            if (local_438 < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_458,"Configuration failed.",
                         (allocator *)
                         ((long)&toWatchList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&toWatchList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cacheArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_478);
              gg_00 = local_298;
              std::__cxx11::string::string((string *)&local_498);
              anon_unknown.dwarf_8a5f88::getCMakeInputs
                        (gg_00,&local_498,(string *)local_288,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_478,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x0);
              std::__cxx11::string::~string((string *)&local_498);
              pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
              local_4c0.this = this;
              std::function<void(std::__cxx11::string_const&,int,int)>::
              function<cmServerProtocol1::ProcessConfigure(cmServerRequest_const&)::__0,void>
                        ((function<void(std::__cxx11::string_const&,int,int)> *)&local_4b8,
                         &local_4c0);
              cmFileMonitor::MonitorPaths
                        (pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_478,&local_4b8);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
              ::~function(&local_4b8);
              pcVar1 = local_20;
              this->m_State = STATE_CONFIGURED;
              this->m_isDirty = false;
              Json::Value::Value(&local_4e8,nullValue);
              cmServerRequest::Reply(__return_storage_ptr__,pcVar1,&local_4e8);
              Json::Value::~Value(&local_4e8);
              cacheArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_478);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&ret,"cacheArguments could not be set.",&local_431);
            cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,(string *)&ret);
            std::__cxx11::string::~string((string *)&ret);
            std::allocator<char>::~allocator((allocator<char> *)&local_431);
            cacheArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_408,"Failed to set CMake paths.",&local_409)
          ;
          cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_408);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator((allocator<char> *)&local_409);
          cacheArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
      }
    }
    else {
      uVar5 = std::__cxx11::string::empty();
      pcVar1 = local_20;
      if ((uVar5 & 1) == 0) goto LAB_0086ebdb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e0,
                 "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                 ,&local_3e1);
      cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      cacheArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2b8,"No build directory set via Handshake.",
               (allocator *)((long)&cachedSourceDir + 7));
    cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cachedSourceDir + 7));
    cacheArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
LAB_0086f009:
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_260);
  Json::Value::~Value((Value *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
LAB_0086f06d:
  std::__cxx11::string::~string((string *)&cm);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto i = passedArgs.begin(); i != passedArgs.end(); ++i) {
        if (!i->isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(i->asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const char* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = std::string(cachedSourceDir);
      cm->SetHomeDirectory(sourceDir);
    }

    const char* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  getCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList, nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}